

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

sexp_conflict json_read(sexp_conflict ctx,sexp_conflict self,sexp_conflict in)

{
  sexp_uint_t sVar1;
  sexp psVar2;
  uint __c;
  ushort **ppuVar3;
  char *pcVar4;
  sexp psVar5;
  char *self_00;
  sexp_conflict psVar6;
  
  self_00 = (char *)self;
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + 0x41) & 0x20) == 0) {
    psVar6 = (sexp_conflict)&DAT_0000201e;
    __c = 0x20;
  }
  else {
    do {
      psVar5 = (in->value).type.setters;
      if (psVar5 == (sexp)0x0) {
        __c = getc((FILE *)(in->value).type.getters);
      }
      else {
        psVar2 = (in->value).type.print;
        if (psVar2 < (sexp)(in->value).port.size) {
          (in->value).type.print = (sexp)((long)&psVar2->tag + 1);
          __c = (uint)*(byte *)((long)&psVar2->tag + (long)&psVar5->tag);
        }
        else {
          self_00 = (char *)in;
          __c = sexp_buffered_read_char(ctx);
        }
      }
    } while ((*(byte *)((long)*ppuVar3 + (long)(int)__c * 2 + 1) & 0x20) != 0);
    psVar6 = (sexp_conflict)((long)(int)__c << 8 | 0x1e);
  }
  if ((int)__c < 0x46) {
    if ((int)__c < 0x30) {
      if (__c == 0x22) {
        psVar6 = json_read_string(ctx,(sexp_conflict)self_00,in);
        return psVar6;
      }
      if ((__c == 0x2b) || (__c == 0x2d)) goto LAB_0010331b;
    }
    else if (__c - 0x30 < 10) {
LAB_0010331b:
      sVar1 = (in->value).bytecode.max_depth;
      if (sVar1 == 0) {
        psVar5 = (in->value).type.getters;
        ungetc(__c,(FILE *)psVar5);
      }
      else {
        psVar2 = (in->value).type.print;
        psVar5 = (sexp)((long)&psVar2[-1].value + 0x60bf);
        (in->value).type.print = psVar5;
        *(char *)((sVar1 - 1) + (long)psVar2) = (char)__c;
      }
      psVar6 = json_read_number(ctx,psVar5,in);
      return psVar6;
    }
  }
  else if ((int)__c < 0x66) {
    if ((int)__c < 0x54) {
      if (__c == 0x46) {
LAB_00103445:
        pcVar4 = "false";
        psVar6 = (sexp_conflict)&DAT_0000003e;
        goto LAB_0010345e;
      }
      if (__c == 0x4e) {
LAB_00103406:
        self_00 = "null";
        psVar6 = (sexp_conflict)sexp_intern(ctx,"null",0xffffffffffffffff);
        pcVar4 = "null";
        goto LAB_0010345e;
      }
    }
    else {
      if (__c == 0x54) {
LAB_00103430:
        pcVar4 = "true";
        psVar6 = (sexp_conflict)&DAT_0000013e;
LAB_0010345e:
        json_read_literal(ctx,(sexp_conflict)self_00,in,pcVar4,psVar6);
        return psVar6;
      }
      if (__c == 0x5b) {
        psVar6 = json_read_array(ctx,self,in);
        return psVar6;
      }
      if (__c == 0x5d) {
        pcVar4 = "unexpected closing bracket in json";
LAB_00103492:
        psVar6 = (sexp_conflict)&DAT_0000023e;
        goto LAB_00103498;
      }
    }
  }
  else if ((int)__c < 0x74) {
    if (__c == 0x66) goto LAB_00103445;
    if (__c == 0x6e) goto LAB_00103406;
  }
  else {
    if (__c == 0x74) goto LAB_00103430;
    if (__c == 0x7d) {
      pcVar4 = "unexpected closing brace in json";
      goto LAB_00103492;
    }
    if (__c == 0x7b) {
      psVar6 = json_read_object(ctx,self,in);
      return psVar6;
    }
  }
  pcVar4 = "unexpected character in json";
LAB_00103498:
  psVar6 = sexp_json_read_exception(ctx,(sexp_conflict)self_00,pcVar4,in,psVar6);
  return psVar6;
}

Assistant:

sexp json_read (sexp ctx, sexp self, sexp in) {
  sexp res;
  int ch = ' ';
  while (isspace(ch))
    ch = sexp_read_char(ctx, in);
  switch (ch) {
  case '{':
    res = json_read_object(ctx, self, in);
    break;
  case '[':
    res = json_read_array(ctx, self, in);
    break;
  case '"':
    res = json_read_string(ctx, self, in);
    break;
  case '-': case '+':
  case '0': case '1': case '2': case '3': case '4':
  case '5': case '6': case '7': case '8': case '9':
    sexp_push_char(ctx, ch, in);
    res = json_read_number(ctx, self, in);
    break;
  case 'n': case 'N':
    res = json_read_literal(ctx, self, in, "null", sexp_intern(ctx, "null", -1));
    break;
  case 't': case 'T':
    res = json_read_literal(ctx, self, in, "true", SEXP_TRUE);
    break;
  case 'f': case 'F':
    res = json_read_literal(ctx, self, in, "false", SEXP_FALSE);
    break;
  case '}':
    res = sexp_json_read_exception(ctx, self, "unexpected closing brace in json", in, SEXP_NULL);
    break;
  case ']':
    res = sexp_json_read_exception(ctx, self, "unexpected closing bracket in json", in, SEXP_NULL);
    break;
  default:
    res = sexp_json_read_exception(ctx, self, "unexpected character in json", in, sexp_make_character(ch));
    break;
  }
  return res;
}